

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O2

void __thiscall
cppcms::impl::response_headers::
format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,bool complete)

{
  _Rb_tree_node_base *p_Var1;
  response_headers *prVar2;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Rb_tree_node_base *)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::append((string *)io);
    std::__cxx11::string::append((char *)io);
    std::__cxx11::string::append((string *)io);
    std::__cxx11::string::append((char *)io);
  }
  prVar2 = this + 0x30;
  while (prVar2 = *(response_headers **)prVar2, prVar2 != this + 0x30) {
    std::__cxx11::string::append((string *)io);
    std::__cxx11::string::append((char *)io);
  }
  if (complete) {
    std::__cxx11::string::append((char *)io);
    return;
  }
  return;
}

Assistant:

void format_cgi_headers(IODevice &io,bool complete) const
	{
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}